

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger container_findvalue(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQNativeClosure *pSVar3;
  bool bVar4;
  SQInteger SVar5;
  SQRESULT SVar6;
  SQObjectPtr *pSVar7;
  SQObjectPtr *pSVar8;
  long lVar9;
  SQObjectPtr *pSVar10;
  long params;
  SQObjectPtr local_48;
  
  SVar5 = sq_gettop(v);
  if (3 < SVar5) {
    SVar6 = sq_throwerror(v,"Too many arguments for findvalue()");
    return SVar6;
  }
  pSVar7 = SQVM::GetAt(v,v->_stackbase);
  pSVar8 = SQVM::GetAt(v,v->_stackbase + 1);
  SVar2 = (pSVar8->super_SQObject)._type;
  pSVar3 = (pSVar8->super_SQObject)._unVal.pNativeClosure;
  if (SVar2 == OT_NATIVECLOSURE) {
    lVar9 = pSVar3->_nparamscheck;
    params = 4;
    if (0 < lVar9) {
      params = lVar9;
    }
  }
  else {
    params = -1;
    if (SVar2 == OT_CLOSURE) {
      params = *(long *)((pSVar3->_typecheck)._alloc_ctx + 0xb0);
    }
  }
  sq_pushnull(v);
  lVar9 = sq_next(v,1);
  while( true ) {
    if (lVar9 < 0) {
      sq_pop(v,1);
      SVar5 = sq_gettop(v);
      return (ulong)(2 < SVar5);
    }
    SVar5 = sq_gettop(v);
    local_48.super_SQObject._type = (pSVar8->super_SQObject)._type;
    local_48.super_SQObject._flags = (pSVar8->super_SQObject)._flags;
    local_48.super_SQObject._5_3_ = *(undefined3 *)&(pSVar8->super_SQObject).field_0x5;
    local_48.super_SQObject._unVal = (SQObjectValue)(pSVar8->super_SQObject)._unVal.pTable;
    if ((local_48.super_SQObject._0_8_ & 0x8000000) != 0) {
      pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    SQVM::Push(v,&local_48);
    SQObjectPtr::~SQObjectPtr(&local_48);
    local_48.super_SQObject._type = (pSVar7->super_SQObject)._type;
    local_48.super_SQObject._flags = (pSVar7->super_SQObject)._flags;
    local_48.super_SQObject._5_3_ = *(undefined3 *)&(pSVar7->super_SQObject).field_0x5;
    local_48.super_SQObject._unVal = (SQObjectValue)(pSVar7->super_SQObject)._unVal.pTable;
    if ((local_48.super_SQObject._0_8_ & 0x8000000) != 0) {
      pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    SQVM::Push(v,&local_48);
    SQObjectPtr::~SQObjectPtr(&local_48);
    if (SVar5 < 0) {
      pSVar10 = SQVM::GetUp(v,SVar5);
    }
    else {
      pSVar10 = SQVM::GetAt(v,v->_stackbase + SVar5 + -1);
    }
    SQVM::Push(v,pSVar10);
    if (2 < params) {
      if (SVar5 < 1) {
        pSVar10 = SQVM::GetUp(v,SVar5 + -1);
      }
      else {
        pSVar10 = SQVM::GetAt(v,v->_stackbase + SVar5 + -2);
      }
      SQVM::Push(v,pSVar10);
      if (params != 3) {
        local_48.super_SQObject._type = (pSVar7->super_SQObject)._type;
        local_48.super_SQObject._flags = (pSVar7->super_SQObject)._flags;
        local_48.super_SQObject._5_3_ = *(undefined3 *)&(pSVar7->super_SQObject).field_0x5;
        local_48.super_SQObject._unVal = (SQObjectValue)(pSVar7->super_SQObject)._unVal.pTable;
        if ((local_48.super_SQObject._0_8_ & 0x8000000) != 0) {
          pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        SQVM::Push(v,&local_48);
        SQObjectPtr::~SQObjectPtr(&local_48);
      }
    }
    SVar6 = sq_call(v,params,1,1);
    if (SVar6 < 0) break;
    pSVar10 = SQVM::GetUp(v,-1);
    bVar4 = SQVM::IsFalse(pSVar10);
    if (!bVar4) {
      if (SVar5 < 0) {
        pSVar7 = SQVM::GetUp(v,SVar5);
      }
      else {
        pSVar7 = SQVM::GetAt(v,v->_stackbase + SVar5 + -1);
      }
      SQVM::Push(v,pSVar7);
      return 1;
    }
    SQVM::Pop(v,4);
    lVar9 = sq_next(v,1);
  }
  return -1;
}

Assistant:

static SQInteger container_findvalue(HSQUIRRELVM v)
{
    if (sq_gettop(v) > 3)
        return sq_throwerror(v, _SC("Too many arguments for findvalue()"));

    SQObject &o = stack_get(v,1);
    SQObject &closure = stack_get(v, 2);
    SQInteger nArgs = get_allowed_args_count(closure, 4);

    sq_pushnull(v);
    while (SQ_SUCCEEDED(sq_next(v, 1))) {
        SQInteger iterTop = sq_gettop(v);
        v->Push(closure);
        v->Push(o);
        v->Push(stack_get(v, iterTop));
        if (nArgs >= 3)
            v->Push(stack_get(v, iterTop-1));
        if (nArgs >= 4)
            v->Push(o);

        if (SQ_FAILED(sq_call(v,nArgs,SQTrue,SQ_BASELIB_INVOKE_CB_ERR_HANDLER))) {
            return SQ_ERROR;
        }
        if (!v->IsFalse(stack_get(v, -1))) {
            v->Push(stack_get(v, iterTop));
            return 1;
        }
        v->Pop(4);
    }
    sq_pop(v, 1); // pops the iterator

    return sq_gettop(v) > 2 ? 1 : 0;
}